

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

EffectiveSign __thiscall
slang::ast::Expression::getEffectiveSign(Expression *this,bool isForConversion)

{
  undefined1 isForConversion_00;
  EffectiveSign EVar1;
  byte in_SIL;
  EffectiveSignVisitor *in_RDI;
  EffectiveSignVisitor visitor;
  undefined7 in_stack_fffffffffffffff0;
  
  isForConversion_00 = in_SIL & 1;
  anon_unknown.dwarf_d910b3::EffectiveSignVisitor::EffectiveSignVisitor
            ((EffectiveSignVisitor *)&stack0xfffffffffffffff6,(bool)isForConversion_00);
  EVar1 = visit<(anonymous_namespace)::EffectiveSignVisitor&>
                    ((Expression *)CONCAT17(isForConversion_00,in_stack_fffffffffffffff0),in_RDI);
  return EVar1;
}

Assistant:

Expression::EffectiveSign Expression::getEffectiveSign(bool isForConversion) const {
    EffectiveSignVisitor visitor(isForConversion);
    return visit(visitor);
}